

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qradiobutton.cpp
# Opt level: O0

bool __thiscall QRadioButton::event(QRadioButton *this,QEvent *e)

{
  bool bVar1;
  Type TVar2;
  QEvent *in_RSI;
  QStyleOption *in_RDI;
  SubElement unaff_retaddr;
  QWidgetPrivate *in_stack_00000008;
  QRadioButtonPrivate *d;
  
  d_func((QRadioButton *)0x668541);
  TVar2 = QEvent::type(in_RSI);
  if (TVar2 == StyleChange) {
    QWidgetPrivate::setLayoutItemMargins(in_stack_00000008,unaff_retaddr,in_RDI);
  }
  bVar1 = QAbstractButton::event((QAbstractButton *)in_RDI,in_RSI);
  return bVar1;
}

Assistant:

bool QRadioButton::event(QEvent *e)
{
    Q_D(QRadioButton);
    if (e->type() == QEvent::StyleChange
#ifdef Q_OS_MAC
            || e->type() == QEvent::MacSizeChange
#endif
            )
        d->setLayoutItemMargins(QStyle::SE_RadioButtonLayoutItem);
    return QAbstractButton::event(e);
}